

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPRequest::getp_getHeaders
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uint uVar1;
  CVmObjPageEntry *pCVar2;
  char *pcVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  undefined4 uVar5;
  vm_val_t *pvVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  char *pcVar9;
  size_t keylen;
  size_t len;
  undefined4 in_register_00000034;
  int in_R8D;
  undefined8 *puVar10;
  
  if (getp_getHeaders(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar7 = __cxa_guard_acquire(&getp_getHeaders(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                CONCAT44(in_register_00000034,self));
    if (iVar7 != 0) {
      getp_getHeaders::desc.min_argc_ = 0;
      getp_getHeaders::desc.opt_argc_ = 0;
      getp_getHeaders::desc.varargs_ = 0;
      __cxa_guard_release(&getp_getHeaders(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getHeaders::desc);
  if (iVar7 == 0) {
    puVar10 = *(undefined8 **)(*(long *)(this->super_CVmObject).ext_ + 0x58);
    vVar8 = CVmObjLookupTable::create(0,0x20,0x40);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar8;
    pvVar6 = sp_;
    uVar5 = *(undefined4 *)&retval->field_0x4;
    aVar4 = retval->val;
    sp_ = sp_ + 1;
    pvVar6->typ = retval->typ;
    *(undefined4 *)&pvVar6->field_0x4 = uVar5;
    pvVar6->val = aVar4;
    uVar1 = (retval->val).obj;
    pCVar2 = G_obj_table_X.pages_[uVar1 >> 0xc];
    pcVar3 = (char *)*puVar10;
    pcVar9 = (char *)strlen(pcVar3);
    add_parsed_val((CVmObjLookupTable *)(pCVar2 + (uVar1 & 0xfff)),(int)pcVar3,pcVar9,0,in_R8D);
    while (puVar10 = (undefined8 *)puVar10[2], puVar10 != (undefined8 *)0x0) {
      pcVar3 = (char *)*puVar10;
      keylen = strlen(pcVar3);
      pcVar9 = (char *)puVar10[1];
      len = strlen(pcVar9);
      add_parsed_val((CVmObjLookupTable *)(pCVar2 + (uVar1 & 0xfff)),pcVar3,keylen,pcVar9,len,0);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getHeaders(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   The first item in the list is the special "request line," with the
     *   HTTP verb and resource name; it's not really a header, as it doesn't
     *   have a name/value pair, so we file it under the key [1]. 
     */
    add_parsed_val(vmg_ tab, 1, hdrs->name, strlen(hdrs->name), ENCMODE_NONE);

    /* add the rest as key/value pairs */
    for (hdrs = hdrs->nxt ; hdrs != 0 ; hdrs = hdrs->nxt)
        add_parsed_val(vmg_ tab, hdrs->name, strlen(hdrs->name),
                       hdrs->value, strlen(hdrs->value), ENCMODE_NONE);

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}